

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O0

vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>_>_>
* build_base_boundary_column_matrix<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>>>
            (vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>_>_>
             *__return_storage_ptr__,Column_settings *settings)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  reference __args;
  Column_settings *local_188;
  allocator<unsigned_int> local_179;
  uint local_178 [4];
  iterator local_168;
  size_type local_160;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_158;
  Column_settings *local_140;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_138;
  Column_settings *local_118;
  allocator<unsigned_int> local_109;
  uint local_108 [6];
  iterator local_f0;
  size_type local_e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e0;
  Column_settings *local_c8;
  allocator<unsigned_int> local_b9;
  uint local_b8 [6];
  iterator local_a0;
  size_type local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_90;
  Column_settings *local_78 [3];
  allocator<unsigned_int> local_59;
  uint local_58 [4];
  iterator local_48;
  size_type local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  undefined1 local_19;
  Column_settings *local_18;
  Column_settings *settings_local;
  vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>_>_>
  *matrix;
  
  local_19 = 0;
  local_18 = settings;
  settings_local = (Column_settings *)__return_storage_ptr__;
  std::
  vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>_>_>
  ::vector(__return_storage_ptr__);
  local_58[0] = 0;
  local_58[1] = 1;
  local_58[2] = 3;
  local_58[3] = 5;
  local_48 = local_58;
  local_40 = 4;
  std::allocator<unsigned_int>::allocator(&local_59);
  __l_02._M_len = local_40;
  __l_02._M_array = local_48;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_38,__l_02,&local_59);
  local_78[0] = local_18;
  std::
  vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>>>>
  ::
  emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>,Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>::Column_z2_settings*>
            ((vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>>>>
              *)__return_storage_ptr__,&local_38,local_78);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_38);
  std::allocator<unsigned_int>::~allocator(&local_59);
  local_b8[0] = 0;
  local_b8[1] = 1;
  local_b8[2] = 2;
  local_b8[3] = 5;
  local_b8[4] = 6;
  local_a0 = local_b8;
  local_98 = 5;
  std::allocator<unsigned_int>::allocator(&local_b9);
  __l_01._M_len = local_98;
  __l_01._M_array = local_a0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_90,__l_01,&local_b9);
  local_c8 = local_18;
  std::
  vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>>>>
  ::
  emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>,Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>::Column_z2_settings*>
            ((vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>>>>
              *)__return_storage_ptr__,&local_90,&local_c8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_90);
  std::allocator<unsigned_int>::~allocator(&local_b9);
  local_108[0] = 0;
  local_108[1] = 1;
  local_108[2] = 2;
  local_108[3] = 5;
  local_108[4] = 6;
  local_f0 = local_108;
  local_e8 = 5;
  std::allocator<unsigned_int>::allocator(&local_109);
  __l_00._M_len = local_e8;
  __l_00._M_array = local_f0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_e0,__l_00,&local_109);
  local_118 = local_18;
  std::
  vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>>>>
  ::
  emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>,Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>::Column_z2_settings*>
            ((vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>>>>
              *)__return_storage_ptr__,&local_e0,&local_118);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_e0);
  std::allocator<unsigned_int>::~allocator(&local_109);
  local_138.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_138);
  local_140 = local_18;
  std::
  vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>>>>
  ::
  emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>,Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>::Column_z2_settings*>
            ((vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>>>>
              *)__return_storage_ptr__,&local_138,&local_140);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_138);
  local_178[0] = 0;
  local_178[1] = 1;
  local_178[2] = 3;
  local_178[3] = 5;
  local_168 = local_178;
  local_160 = 4;
  std::allocator<unsigned_int>::allocator(&local_179);
  __l._M_len = local_160;
  __l._M_array = local_168;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_158,__l,&local_179);
  local_188 = local_18;
  std::
  vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>>>>
  ::
  emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>,Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>::Column_z2_settings*>
            ((vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>>>>
              *)__return_storage_ptr__,&local_158,&local_188);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_158);
  std::allocator<unsigned_int>::~allocator(&local_179);
  __args = std::
           vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>_>_>
           ::operator[](__return_storage_ptr__,1);
  std::
  vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>>>>
  ::
  emplace_back<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>>&>
            ((vector<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>>>>
              *)__return_storage_ptr__,__args);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Column> build_base_boundary_column_matrix(typename Column::Column_settings& settings) {
  std::vector<Column> matrix;

  if constexpr (is_z2<Column>()) {
    using cont = std::vector<unsigned int>;
    matrix.emplace_back(cont{0, 1, 3, 5}, &settings);
    matrix.emplace_back(cont{0, 1, 2, 5, 6}, &settings);
    matrix.emplace_back(cont{0, 1, 2, 5, 6}, &settings);
    matrix.emplace_back(cont{}, &settings);
    matrix.emplace_back(cont{0, 1, 3, 5}, &settings);
    matrix.emplace_back(matrix[1]);
  } else {
    using cont = std::vector<std::pair<unsigned int, typename Column::Field_element> >;
    matrix.emplace_back(cont{{0, 1}, {1, 2}, {3, 3}, {5, 4}}, &settings);
    matrix.emplace_back(cont{{0, 4}, {1, 2}, {2, 1}, {5, 1}, {6, 1}}, &settings);
    matrix.emplace_back(cont{{0, 1}, {1, 3}, {2, 4}, {5, 4}, {6, 4}}, &settings);
    matrix.emplace_back(cont{}, &settings);
    matrix.emplace_back(cont{{0, 1}, {1, 2}, {3, 3}, {5, 4}}, &settings);
    matrix.emplace_back(matrix[1]);
  }

  return matrix;
}